

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlRpcValue.cpp
# Opt level: O1

bool __thiscall XmlRpc::XmlRpcValue::boolFromXml(XmlRpcValue *this,string *valueXml,int *offset)

{
  char *in_RAX;
  ulong uVar1;
  char *__nptr;
  char *valueEnd;
  char *local_28;
  
  __nptr = (valueXml->_M_dataplus)._M_p + *offset;
  local_28 = in_RAX;
  uVar1 = strtol(__nptr,&local_28,10);
  if (uVar1 < 2 && local_28 != __nptr) {
    this->_type = TypeBoolean;
    (this->_value).asBool = uVar1 == 1;
    *offset = *offset + ((int)local_28 - (int)__nptr);
  }
  return uVar1 < 2 && local_28 != __nptr;
}

Assistant:

bool XmlRpcValue::boolFromXml(std::string const& valueXml, int* offset)
  {
    const char* valueStart = valueXml.c_str() + *offset;
    char* valueEnd;
    long ivalue = strtol(valueStart, &valueEnd, 10);
    if (valueEnd == valueStart || (ivalue != 0 && ivalue != 1))
      return false;

    _type = TypeBoolean;
    _value.asBool = (ivalue == 1);
    *offset += int(valueEnd - valueStart);
    return true;
  }